

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionDAGChecker.cxx
# Opt level: O3

Result __thiscall cmGeneratorExpressionDAGChecker::CheckGraph(cmGeneratorExpressionDAGChecker *this)

{
  cmGeneratorExpressionDAGChecker *pcVar1;
  cmGeneratorTarget *pcVar2;
  pointer __s1;
  size_t __n;
  int iVar3;
  cmGeneratorExpressionDAGChecker *pcVar4;
  
  pcVar1 = this->Parent;
  if (pcVar1 != (cmGeneratorExpressionDAGChecker *)0x0) {
    pcVar2 = this->Target;
    __s1 = (this->Property)._M_dataplus._M_p;
    __n = (this->Property)._M_string_length;
    pcVar4 = pcVar1;
    do {
      if (((pcVar2 == pcVar4->Target) && (__n == (pcVar4->Property)._M_string_length)) &&
         ((__n == 0 || (iVar3 = bcmp(__s1,(pcVar4->Property)._M_dataplus._M_p,__n), iVar3 == 0)))) {
        return (pcVar4 != pcVar1) + SELF_REFERENCE;
      }
      pcVar4 = pcVar4->Parent;
    } while (pcVar4 != (cmGeneratorExpressionDAGChecker *)0x0);
  }
  return DAG;
}

Assistant:

cmGeneratorExpressionDAGChecker::Result
cmGeneratorExpressionDAGChecker::CheckGraph() const
{
  const cmGeneratorExpressionDAGChecker* parent = this->Parent;
  while (parent) {
    if (this->Target == parent->Target && this->Property == parent->Property) {
      return (parent == this->Parent) ? SELF_REFERENCE : CYCLIC_REFERENCE;
    }
    parent = parent->Parent;
  }
  return DAG;
}